

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftedMieBondType.hpp
# Opt level: O0

void __thiscall
OpenMD::ShiftedMieBondType::ShiftedMieBondType
          (ShiftedMieBondType *this,RealType mySigma,RealType myEpsilon,int myNrep,int myMatt)

{
  int iVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  BondType *in_RDI;
  _func_int **in_XMM0_Qa;
  __type_conflict _Var2;
  double dVar3;
  _func_int **pp_Var4;
  __type_conflict _Var5;
  RealType in_XMM1_Qa;
  double dVar6;
  RealType rsm;
  RealType rsn;
  RealType rsi;
  RealType rss;
  undefined8 in_stack_ffffffffffffff88;
  int __y;
  double in_stack_ffffffffffffff90;
  
  BondType::BondType(in_RDI,0.0);
  in_RDI->_vptr_BondType = (_func_int **)&PTR__ShiftedMieBondType_00509af8;
  in_RDI[1]._vptr_BondType = in_XMM0_Qa;
  in_RDI[1].r0 = in_XMM1_Qa;
  *(undefined4 *)&in_RDI[2]._vptr_BondType = in_ESI;
  *(undefined4 *)((long)&in_RDI[2]._vptr_BondType + 4) = in_EDX;
  __y = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  _Var2 = std::pow<double,int>(in_stack_ffffffffffffff90,__y);
  dVar3 = log((_Var2 * (double)*(int *)((long)&in_RDI[2]._vptr_BondType + 4)) /
              (double)*(int *)&in_RDI[2]._vptr_BondType);
  pp_Var4 = (_func_int **)exp(dVar3);
  in_RDI[3]._vptr_BondType = pp_Var4;
  iVar1 = *(int *)((long)&in_RDI[2]._vptr_BondType + 4);
  dVar3 = (double)*(int *)&in_RDI[2]._vptr_BondType;
  dVar6 = (double)iVar1;
  dVar6 = pow(dVar3 / dVar6,dVar6 / (double)(*(int *)&in_RDI[2]._vptr_BondType - iVar1));
  in_RDI[2].r0 = (dVar3 * dVar6) /
                 (double)(*(int *)&in_RDI[2]._vptr_BondType -
                         *(int *)((long)&in_RDI[2]._vptr_BondType + 4));
  _Var2 = std::pow<double,int>(dVar3,__y);
  _Var5 = std::pow<double,int>(dVar3,__y);
  in_RDI[3].r0 = in_RDI[2].r0 * in_RDI[1].r0 * (_Var2 - _Var5);
  BondType::setEquilibriumBondLength(in_RDI,(RealType)in_RDI[3]._vptr_BondType);
  return;
}

Assistant:

ShiftedMieBondType(RealType mySigma, RealType myEpsilon, int myNrep,
                       int myMatt) :
        BondType(0.0) {
      sigma   = mySigma;
      epsilon = myEpsilon;
      n       = myNrep;
      m       = myMatt;

      rS_ = exp(log(pow(sigma, m - n) * RealType(m) / n));

      nmScale_ = n * pow(RealType(n) / m, RealType(m) / (n - m)) / (n - m);

      RealType rss = rS_ / sigma;
      RealType rsi = 1.0 / rss;
      RealType rsn = pow(rsi, n);
      RealType rsm = pow(rsi, m);

      potS_ = nmScale_ * epsilon * (rsn - rsm);

      setEquilibriumBondLength(rS_);
    }